

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_bit_decoder.cc
# Opt level: O0

bool __thiscall draco::RAnsBitDecoder::DecodeNextBit(RAnsBitDecoder *this)

{
  int iVar1;
  AnsDecoder *in_RDI;
  uint8_t bit;
  
  iVar1 = rabs_desc_read(in_RDI,*(AnsP8 *)&in_RDI[1].buf);
  return (char)iVar1 != '\0';
}

Assistant:

bool RAnsBitDecoder::DecodeNextBit() {
  const uint8_t bit = rabs_read(&ans_decoder_, prob_zero_);
  return bit > 0;
}